

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O3

_Bool duckdb_je_pa_central_init(pa_central_t *central,base_t *base,_Bool hpa,hpa_hooks_t *hpa_hooks)

{
  _Bool _Var1;
  undefined7 in_register_00000011;
  
  if (((int)CONCAT71(in_register_00000011,hpa) != 0) &&
     (_Var1 = duckdb_je_hpa_central_init(&central->hpa,base,hpa_hooks), _Var1)) {
    return true;
  }
  return false;
}

Assistant:

bool
pa_central_init(pa_central_t *central, base_t *base, bool hpa,
    const hpa_hooks_t *hpa_hooks) {
	bool err;
	if (hpa) {
		err = hpa_central_init(&central->hpa, base, hpa_hooks);
		if (err) {
			return true;
		}
	}
	return false;
}